

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* dominac_frontier(map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *__return_storage_ptr__,
                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom,
                  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes)

{
  int iVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  long lVar6;
  ulong uVar7;
  _Base_ptr __k;
  int runner;
  _Self __tmp;
  vector<int,_std::allocator<int>_> b;
  int local_7c;
  _Base_ptr local_78;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  ulong local_58;
  _Base_ptr local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_50;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_50;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = &(dom->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_60 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &nodes->_M_t;
  for (; local_60 != local_68; local_60 = (_Base_ptr)std::_Rb_tree_increment(local_60)) {
    local_78 = (_Base_ptr)
               std::
               _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
               ::find(local_70,(key_type *)(local_60 + 1));
    p_Var2 = local_78[1]._M_parent[1]._M_right;
    lVar6 = *(long *)(local_78[1]._M_parent + 2);
    if (8 < (ulong)(lVar6 - (long)p_Var2)) {
      __k = local_78 + 1;
      uVar7 = 0;
      while (uVar7 < (ulong)(lVar6 - (long)p_Var2 >> 3)) {
        local_7c = **(int **)(&p_Var2->_M_color + uVar7 * 2);
        local_58 = uVar7;
        pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](dom,(key_type *)__k);
        iVar1 = *pmVar3;
        while (local_7c != iVar1) {
          iVar4 = std::
                  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&__return_storage_ptr__->_M_t,&local_7c);
          if (iVar4._M_node == local_50) {
            local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_48,(value_type_conflict3 *)__k);
            pmVar5 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](__return_storage_ptr__,&local_7c);
            std::vector<int,_std::allocator<int>_>::operator=
                      (pmVar5,(vector<int,_std::allocator<int>_> *)&local_48);
          }
          else {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_48,
                       (vector<int,_std::allocator<int>_> *)&iVar4._M_node[1]._M_parent);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_48,(value_type_conflict3 *)__k);
            pmVar5 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](__return_storage_ptr__,&local_7c);
            std::vector<int,_std::allocator<int>_>::operator=
                      (pmVar5,(vector<int,_std::allocator<int>_> *)&local_48);
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
          pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](dom,&local_7c);
          local_7c = *pmVar3;
        }
        p_Var2 = local_78[1]._M_parent[1]._M_right;
        lVar6 = *(long *)(local_78[1]._M_parent + 2);
        uVar7 = local_58 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, vector<int>> dominac_frontier(map<int, int> dom,
                                       map<int, BasicBlock*> nodes) {
  map<int, vector<int>> dom_f;
  map<int, int>::iterator iter;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    map<int, BasicBlock*>::iterator it = nodes.find(iter->first);
    if (it->second->preBlock.size() > 1) {
      for (int i = 0; i < it->second->preBlock.size(); i++) {
        int runner = it->second->preBlock[i]->id;
        map<int, vector<int>>::iterator itt;
        int idom_b = dom[it->first];
        while (runner != idom_b) {
          // add b to runner's dominance frontier set
          itt = dom_f.find(runner);
          if (itt == dom_f.end()) {
            vector<int> b;
            b.push_back(it->first);
            dom_f[runner] = b;
          } else {
            vector<int> b = itt->second;
            b.push_back(it->first);
            dom_f[runner] = b;
          }
          // runner := idom(runner)
          runner = dom[runner];
        }
      }
    }
  }
  map<int, vector<int>>::iterator i;
  /*cout << endl << "*** desplay dominac frontier ***" << endl;
  for (i = dom_f.begin(); i != dom_f.end(); i++) {
      cout << i->first;
      for (int j = 0; j < i->second.size(); j++) {
          cout << " " << i->second[j];
      }
      cout << endl;
  }*/
  return dom_f;
}